

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O1

int mk_rconf_read(mk_rconf *conf,char *path)

{
  ulong uVar1;
  char cVar2;
  mk_list *pmVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  FILE *__stream;
  char *pcVar7;
  size_t sVar8;
  char **str;
  mk_rconf_section *pmVar9;
  ushort **ppuVar10;
  long lVar11;
  char *pcVar12;
  undefined8 *puVar13;
  ulong uVar14;
  char *pcVar15;
  char cVar16;
  mk_list *pmVar17;
  bool bVar18;
  char *key;
  char *val;
  stat st;
  char tmp [4096];
  uint local_112c;
  char *local_1120;
  int local_1114;
  char *local_1108;
  char *local_1100;
  size_t local_10f8;
  mk_rconf_section *local_10f0;
  char *local_10e8;
  mk_list *local_10e0;
  char *local_10d8;
  mk_list *local_10d0;
  stat local_10c8;
  char local_1038 [4104];
  
  pcVar7 = path;
  if (((-1 < conf->level) && (iVar4 = stat(path,&local_10c8), iVar4 == -1)) &&
     (piVar6 = __errno_location(), *piVar6 == 2)) {
    if (*path == '/') {
      return -1;
    }
    if (conf->root_path != (char *)0x0) {
      pcVar7 = local_1038;
      snprintf(pcVar7,0x1000,"%s/%s",conf->root_path,path);
    }
  }
  for (pmVar17 = (conf->includes).next; pmVar17 != &conf->includes; pmVar17 = pmVar17->next) {
    iVar4 = strcmp((char *)pmVar17[-1].next,pcVar7);
    if (iVar4 == 0) {
      pcVar15 = "[config] file already included %s";
      iVar4 = 0x1001;
      goto LAB_00111e54;
    }
  }
  conf->level = conf->level + 1;
  __stream = fopen(pcVar7,"r");
  if (__stream == (FILE *)0x0) {
    pcVar15 = "[config] I cannot open %s file";
    iVar4 = 0x1002;
LAB_00111e54:
    mk_print(iVar4,pcVar15,pcVar7);
  }
  else {
    pcVar7 = (char *)malloc(0x1000);
    if (pcVar7 == (char *)0x0) {
      perror("malloc");
    }
    if (pcVar7 == (char *)0x0) {
      fclose(__stream);
      perror("malloc");
    }
    pcVar15 = fgets(pcVar7,0x1000,__stream);
    if (pcVar15 == (char *)0x0) {
      local_1120 = (char *)0x0;
    }
    else {
      local_10e0 = &conf->sections;
      local_10d0 = &conf->metas;
      local_10d8 = pcVar7 + 9;
      local_10f8 = 0xffffffff;
      local_10f0 = (mk_rconf_section *)0x0;
      local_1120 = (char *)0x0;
      local_1114 = 0;
      local_112c = 0;
      do {
        sVar8 = strlen(pcVar7);
        iVar4 = (int)sVar8;
        if ((iVar4 < 1) || (pcVar7[iVar4 - 1] != '\n')) {
          iVar4 = feof(__stream);
          uVar14 = sVar8 & 0xffffffff;
          if (iVar4 == 0) {
            mk_print(0x1001,"File %s",path);
            mk_print(0x1001,"Error in line %i: %s",(ulong)local_112c,
                     "Length of content has exceeded limit");
            fclose(__stream);
            goto LAB_00111f32;
          }
        }
        else {
          uVar14 = (ulong)(iVar4 - 1U);
          pcVar7[uVar14] = '\0';
          if (iVar4 - 1U == 0) {
            uVar14 = 0;
          }
          else if (pcVar7[iVar4 - 2] == '\r') {
            uVar14 = (ulong)(iVar4 - 2);
            pcVar7[uVar14] = '\0';
          }
        }
        local_112c = local_112c + 1;
        cVar16 = *pcVar7;
        if ((cVar16 != '\0') && (cVar16 != '#')) {
          iVar4 = (int)uVar14;
          if ((iVar4 < 10) ||
             (iVar5 = strncasecmp(pcVar7,"@INCLUDE ",9), pcVar15 = local_10d8, iVar5 != 0)) {
            if (iVar4 < 4 || cVar16 != '@') {
              if (cVar16 == '[') {
                iVar4 = mk_string_char_search(pcVar7,0x5d,iVar4);
                if (iVar4 < 1) {
                  bVar18 = false;
                  mk_print(0x1001,"File %s",path);
                  mk_print(0x1001,"Error in line %i: %s",(ulong)local_112c,"Bad header definition");
                  fclose(__stream);
                  pcVar15 = pcVar7;
                }
                else {
                  if (local_1114 == 0 && local_10f0 != (mk_rconf_section *)0x0) {
                    mk_print(0x1002,"Config file warning \'%s\':\n\t\t\t\tat line %i: %s",path,
                             (ulong)local_112c,"Previous section did not have keys");
                  }
                  pcVar15 = mk_string_copy_substr(pcVar7,1,iVar4);
                  pmVar9 = mk_rconf_section_add(conf,pcVar15);
                  if (pmVar9 == (mk_rconf_section *)0x0) {
                    fclose(__stream);
                    if (local_1120 != (char *)0x0) {
                      free(local_1120);
                    }
                    free(pcVar7);
                    local_10f0 = (mk_rconf_section *)0x0;
                    bVar18 = false;
                  }
                  else {
                    bVar18 = true;
                    local_1114 = 0;
                    local_10f0 = pmVar9;
                  }
                }
                free(pcVar15);
                if (!bVar18) {
                  return -1;
                }
              }
              else {
                if (local_1120 == (char *)0x0) {
                  local_10f8 = 1;
                  if (1 < iVar4) {
                    local_10f8 = uVar14;
                  }
                  iVar5 = (int)local_10f8;
                  uVar14 = 0;
                  do {
                    if (iVar5 - 1 == uVar14) {
                      iVar5 = (int)local_10f8;
                      goto LAB_00111c0f;
                    }
                    uVar1 = uVar14 + 1;
                    ppuVar10 = __ctype_b_loc();
                    lVar11 = uVar14 + 1;
                    uVar14 = uVar1;
                  } while (((*ppuVar10)[pcVar7[lVar11]] & 1) != 0);
                  iVar5 = (int)uVar1;
LAB_00111c0f:
                  local_1120 = mk_string_copy_substr(pcVar7,0,iVar5);
                  local_10f8 = strlen(local_1120);
                  if (iVar5 == iVar4) goto LAB_00111df5;
                }
                cVar16 = *pcVar7;
                bVar18 = *local_1120 == '\0';
                if (cVar16 == *local_1120 && !bVar18) {
                  lVar11 = 1;
                  do {
                    cVar16 = pcVar7[lVar11];
                    cVar2 = local_1120[lVar11];
                    bVar18 = cVar2 == '\0';
                    if (cVar16 != cVar2) break;
                    lVar11 = lVar11 + 1;
                  } while (cVar2 != '\0');
                }
                ppuVar10 = __ctype_b_loc();
                if (!bVar18) {
                  pcVar7 = "[config] Inconsistent use of tab and space";
                  if (((*ppuVar10)[cVar16] & 1) == 0) {
                    pcVar7 = "[config] Indentation level is too low";
                  }
LAB_00111f93:
                  mk_print(0x1001,pcVar7);
                  mk_config_error(path,local_112c,"Invalid indentation level");
                  fclose(__stream);
                  return -1;
                }
                if (((*ppuVar10)[cVar16] & 1) != 0) {
                  pcVar7 = "[config] Extra indentation level found";
                  goto LAB_00111f93;
                }
                iVar4 = iVar4 - (int)local_10f8;
                if ((iVar4 != 0 && pcVar7[(int)local_10f8] != '#') &&
                   ((pcVar15 = pcVar7 + (int)local_10f8, iVar4 < 3 ||
                    (iVar5 = strncmp(pcVar15,"---",3), iVar5 != 0)))) {
                  iVar5 = mk_string_char_search(pcVar15,0x20,iVar4);
                  local_1108 = mk_string_copy_substr(pcVar15,0,iVar5);
                  local_1100 = mk_string_copy_substr(pcVar15 + iVar5,1,iVar4 - iVar5);
                  if ((iVar5 < 0) || ((local_1108 == (char *)0x0 || (local_1100 == (char *)0x0)))) {
                    pcVar7 = "Each key must have a value";
                  }
                  else {
                    mk_string_trim(&local_1108);
                    mk_string_trim(&local_1100);
                    pcVar15 = local_1100;
                    if (*local_1100 != '\0') {
                      if ((conf->sections).next == local_10e0) {
                        mk_print(0x1001,"Error: there are not sections available on %s!",conf->file)
                        ;
                      }
                      else {
                        local_10e8 = local_1108;
                        pmVar17 = local_10e0->prev;
                        puVar13 = (undefined8 *)malloc(0x20);
                        if (puVar13 == (undefined8 *)0x0) {
                          perror("malloc");
                        }
                        pcVar12 = mk_string_dup(local_10e8);
                        *puVar13 = pcVar12;
                        pcVar15 = mk_string_dup(pcVar15);
                        puVar13[1] = pcVar15;
                        pmVar3 = pmVar17[-1].prev;
                        pmVar17[-1].prev = (mk_list *)(puVar13 + 2);
                        puVar13[3] = pmVar17 + -1;
                        puVar13[2] = pmVar3;
                        pmVar3->next = (mk_list *)(puVar13 + 2);
                      }
                      free(local_1108);
                      free(local_1100);
                      local_1114 = local_1114 + 1;
                      goto LAB_00111df5;
                    }
                    pcVar7 = "Key has an empty value";
                  }
                  mk_config_error(path,local_112c,pcVar7);
                  fclose(__stream);
                  free(local_1108);
                  pcVar7 = local_1100;
LAB_00111f32:
                  free(pcVar7);
                  return -1;
                }
              }
            }
            else {
              str = (char **)malloc(0x20);
              if (str == (char **)0x0) {
                perror("malloc");
              }
              if (str == (char **)0x0) goto LAB_00111f5b;
              pcVar15 = strchr(pcVar7,0x20);
              iVar5 = (int)pcVar15 - (int)pcVar7;
              pcVar15 = mk_string_copy_substr(pcVar7,1,iVar5);
              *str = pcVar15;
              mk_string_trim(str);
              pcVar15 = mk_string_copy_substr(pcVar7,iVar5 + 1,iVar4);
              str[1] = pcVar15;
              mk_string_trim(str + 1);
              pmVar17 = local_10d0->prev;
              local_10d0->prev = (mk_list *)(str + 2);
              str[3] = (char *)local_10d0;
              str[2] = (char *)pmVar17;
              pmVar17->next = (mk_list *)(str + 2);
            }
          }
          else {
            pcVar12 = strchr(local_10d8,0x2a);
            if (pcVar12 == (char *)0x0) {
              iVar4 = mk_rconf_read(conf,pcVar15);
            }
            else {
              iVar4 = mk_rconf_read_glob(conf,pcVar15);
            }
            if (iVar4 == -1) {
              conf->level = conf->level + -1;
LAB_00111f5b:
              fclose(__stream);
              if (local_1120 != (char *)0x0) {
                free(local_1120);
              }
              goto LAB_00111f32;
            }
          }
        }
LAB_00111df5:
        pcVar15 = fgets(pcVar7,0x1000,__stream);
      } while (pcVar15 != (char *)0x0);
    }
    fclose(__stream);
    if (local_1120 != (char *)0x0) {
      free(local_1120);
    }
    free(pcVar7);
    puVar13 = (undefined8 *)malloc(0x18);
    if (puVar13 == (undefined8 *)0x0) {
      perror("malloc");
    }
    if (puVar13 != (undefined8 *)0x0) {
      pcVar7 = mk_string_dup(path);
      *puVar13 = pcVar7;
      pmVar17 = (conf->includes).prev;
      (conf->includes).prev = (mk_list *)(puVar13 + 1);
      puVar13[2] = &conf->includes;
      puVar13[1] = pmVar17;
      pmVar17->next = (mk_list *)(puVar13 + 1);
      conf->level = conf->level + -1;
      return 0;
    }
    conf->level = conf->level + -1;
  }
  return -1;
}

Assistant:

static int mk_rconf_read(struct mk_rconf *conf, const char *path)
{
    int i;
    int len;
    int ret;
    int line = 0;
    int indent_len = -1;
    int n_keys = 0;
    char *buf;
    char tmp[PATH_MAX];
    char *section = NULL;
    char *indent = NULL;
    char *key, *val;
    char *cfg_file = (char *) path;
    struct stat st;
    struct mk_rconf_file *file;
    struct mk_rconf_section *current = NULL;
    FILE *f;

    /* Check if the path exists (relative cases for included files) */
    if (conf->level >= 0) {
        ret = stat(path, &st);
        if (ret == -1 && errno == ENOENT) {
            /* Try to resolve the real path (if exists) */
            if (path[0] == '/') {
                return -1;
            }

            if (conf->root_path) {
                snprintf(tmp, PATH_MAX, "%s/%s", conf->root_path, path);
                cfg_file = tmp;
            }
        }
    }

    /* Check this file have not been included before */
    ret = is_file_included(conf, cfg_file);
    if (ret == MK_TRUE) {
        mk_err("[config] file already included %s", cfg_file);
        return -1;
    }

    conf->level++;

    /* Open configuration file */
    if ((f = fopen(cfg_file, "r")) == NULL) {
        mk_warn("[config] I cannot open %s file", cfg_file);
        return -1;
    }

    /* Allocate temporal buffer to read file content */
    buf = mk_mem_alloc(MK_RCONF_KV_SIZE);
    if (!buf) {
        fclose(f);
        perror("malloc");
        return -1;
    }

    /* looking for configuration directives */
    while (fgets(buf, MK_RCONF_KV_SIZE, f)) {
        len = strlen(buf);
        if (len > 0 && buf[len - 1] == '\n') {
            buf[--len] = 0;
            if (len && buf[len - 1] == '\r') {
                buf[--len] = 0;
            }
        }
        else {
            /*
             * If we don't find a break line, validate if we got an EOF or not. No EOF
             * means that the incoming string is not finished so we must raise an
             * exception.
             */
            if (!feof(f)) {
                mk_config_error(path, line, "Length of content has exceeded limit");
                fclose(f);
                mk_mem_free(buf);
                return -1;
            }
        }

        /* Line number */
        line++;

        if (!buf[0]) {
            continue;
        }

        /* Skip commented lines */
        if (buf[0] == '#') {
            continue;
        }

        if (len > 9 && strncasecmp(buf, "@INCLUDE ", 9) == 0) {
            if (strchr(buf + 9, '*') != NULL) {
                ret = mk_rconf_read_glob(conf, buf + 9);
            }
            else {
                ret = mk_rconf_read(conf, buf + 9);
            }
            if (ret == -1) {
                conf->level--;
                fclose(f);
                if (indent) {
                    mk_mem_free(indent);
                }
                mk_mem_free(buf);
                return -1;
            }
            continue;
        }
        else if (buf[0] == '@' && len > 3) {
            ret = mk_rconf_meta_add(conf, buf, len);
            if (ret == -1) {
                fclose(f);
                if (indent) {
                    mk_mem_free(indent);
                }
                mk_mem_free(buf);
                return -1;
            }
            continue;
        }

        /* Section definition */
        if (buf[0] == '[') {
            int end = -1;
            end = mk_string_char_search(buf, ']', len);
            if (end > 0) {
                /*
                 * Before to add a new section, lets check the previous
                 * one have at least one key set
                 */
                if (current && n_keys == 0) {
                    mk_rconf_warning(path, line, "Previous section did not have keys");
                }

                /* Create new section */
                section = mk_string_copy_substr(buf, 1, end);
                current = mk_rconf_section_add(conf, section);
                if (!current) {
                    fclose(f);
                    if (indent) {
                        mk_mem_free(indent);
                    }
                    mk_mem_free(buf);
                    mk_mem_free(section);
                    return -1;
                }
                mk_mem_free(section);
                n_keys = 0;
                continue;
            }
            else {
                mk_config_error(path, line, "Bad header definition");
                fclose(f);
                mk_mem_free(buf);
                return -1;
            }
        }

        /* No separator defined */
        if (!indent) {
            i = 0;

            do { i++; } while (i < len && isblank(buf[i]));

            indent = mk_string_copy_substr(buf, 0, i);
            indent_len = strlen(indent);

            /* Blank indented line */
            if (i == len) {
                continue;
            }
        }

        /* Validate indentation level */
        if (check_indent(buf, indent) < 0) {
            mk_config_error(path, line, "Invalid indentation level");
            fclose(f);
            return -1;
        }

        if (buf[indent_len] == '#' || indent_len == len) {
            continue;
        }

        if (len - indent_len >= 3 && strncmp(buf + indent_len, "---", 3) == 0) {
            continue;
        }

        /* Get key and val */
        i = mk_string_char_search(buf + indent_len, ' ', len - indent_len);
        key = mk_string_copy_substr(buf + indent_len, 0, i);
        val = mk_string_copy_substr(buf + indent_len + i, 1, len - indent_len - i);

        if (!key || !val || i < 0) {
            mk_config_error(path, line, "Each key must have a value");
            fclose(f);
            mk_mem_free(key);
            mk_mem_free(val);
            return -1;
        }

        /* Trim strings */
        mk_string_trim(&key);
        mk_string_trim(&val);

        if (strlen(val) == 0) {
            mk_config_error(path, line, "Key has an empty value");
            fclose(f);
            mk_mem_free(key);
            mk_mem_free(val);
            return -1;
        }

        /* Register entry: key and val are copied as duplicated */
        mk_rconf_section_entry_add(conf, key, val);

        /* Free temporal key and val */
        mk_mem_free(key);
        mk_mem_free(val);

        n_keys++;
    }

    if (section && n_keys == 0) {
        /* No key, no warning */
    }

    /*
    struct mk_config_section *s;
    struct mk_rconf_entry *e;

    s = conf->section;
    while(s) {
        printf("\n[%s]", s->name);
        e = s->entry;
        while(e) {
            printf("\n   %s = %s", e->key, e->val);
            e = e->next;
        }
        s = s->next;
    }
    fflush(stdout);
    */
    fclose(f);
    if (indent) {
        mk_mem_free(indent);
    }
    mk_mem_free(buf);

    /* Append this file to the list */
    file = mk_mem_alloc(sizeof(struct mk_rconf_file));
    if (!file) {
        conf->level--;
        return -1;
    }

    file->path = mk_string_dup(path);
    mk_list_add(&file->_head, &conf->includes);
    conf->level--;
    return 0;
}